

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TermIterators.hpp
# Opt level: O3

void __thiscall
Kernel::DisagreementSetIterator::reset
          (DisagreementSetIterator *this,TermList t1,TermList t2,bool disjunctVariables)

{
  TermList ***pppTVar1;
  uint uVar2;
  bool bVar3;
  TermList **ppTVar4;
  
  (this->_stack)._cursor = (this->_stack)._stack;
  this->_disjunctVariables = disjunctVariables;
  bVar3 = TermList::sameTop(t1,t2);
  if ((!bVar3) || (disjunctVariables && (t1._content & 1) != 0)) {
    (this->_arg1)._content = t1._content;
    (this->_arg2)._content = t2._content;
  }
  else {
    (this->_arg1)._content = 2;
    if (((t1._content & 3) == 0) && (uVar2 = *(uint *)(t1._content + 0xc), (uVar2 & 0xfffffff) != 0)
       ) {
      ppTVar4 = (this->_stack)._cursor;
      if (ppTVar4 == (this->_stack)._end) {
        Lib::Stack<Kernel::TermList_*>::expand(&this->_stack);
        ppTVar4 = (this->_stack)._cursor;
      }
      *ppTVar4 = (TermList *)(t1._content + ((ulong)uVar2 & 0xfffffff) * 8 + 0x28);
      ppTVar4 = (this->_stack)._cursor + 1;
      (this->_stack)._cursor = ppTVar4;
      uVar2 = *(uint *)(t2._content + 0xc);
      if (ppTVar4 == (this->_stack)._end) {
        Lib::Stack<Kernel::TermList_*>::expand(&this->_stack);
        ppTVar4 = (this->_stack)._cursor;
      }
      *ppTVar4 = (TermList *)(t2._content + (ulong)(uVar2 & 0xfffffff) * 8 + 0x28);
      pppTVar1 = &(this->_stack)._cursor;
      *pppTVar1 = *pppTVar1 + 1;
    }
  }
  return;
}

Assistant:

void reset(TermList t1, TermList t2, bool disjunctVariables=true)
  {
    ASS(!t1.isEmpty());
    ASS(!t2.isEmpty());

    _stack.reset();
    _disjunctVariables=disjunctVariables;
    if(!TermList::sameTop(t1,t2) || (t1.isVar() && disjunctVariables)) {
      _arg1=t1;
      _arg2=t2;
      return;
    }
    _arg1 = TermList::empty();
    if(t1.isTerm() && t1.term()->arity()>0) {
      _stack.push(t1.term()->args());
      _stack.push(t2.term()->args());
    }
  }